

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::PushStyleColor(ImPlotCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImPlotContext *pIVar8;
  ImGuiColorMod *__dest;
  int iVar9;
  int iVar10;
  ImVec4 *pIVar11;
  ImVec4 IVar12;
  
  pIVar8 = GImPlot;
  pIVar11 = (GImPlot->Style).Colors + idx;
  fVar4 = pIVar11->x;
  fVar5 = pIVar11->y;
  pIVar1 = (GImPlot->Style).Colors + idx;
  fVar6 = pIVar1->z;
  fVar7 = pIVar1->w;
  iVar10 = (GImPlot->ColorModifiers).Size;
  iVar2 = (GImPlot->ColorModifiers).Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar2 < iVar10) {
      __dest = (ImGuiColorMod *)ImGui::MemAlloc((long)iVar10 * 0x14);
      pIVar3 = (pIVar8->ColorModifiers).Data;
      if (pIVar3 != (ImGuiColorMod *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar8->ColorModifiers).Size * 0x14);
        ImGui::MemFree((pIVar8->ColorModifiers).Data);
      }
      (pIVar8->ColorModifiers).Data = __dest;
      (pIVar8->ColorModifiers).Capacity = iVar10;
    }
  }
  pIVar3 = (pIVar8->ColorModifiers).Data;
  iVar10 = (pIVar8->ColorModifiers).Size;
  pIVar3[iVar10].Col = idx;
  pIVar1 = &pIVar3[iVar10].BackupValue;
  pIVar1->x = fVar4;
  pIVar1->y = fVar5;
  pIVar1->z = fVar6;
  pIVar1->w = fVar7;
  (pIVar8->ColorModifiers).Size = (pIVar8->ColorModifiers).Size + 1;
  IVar12 = ImGui::ColorConvertU32ToFloat4(col);
  *pIVar11 = IVar12;
  return;
}

Assistant:

void PushStyleColor(ImPlotCol idx, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = gp.Style.Colors[idx];
    gp.ColorModifiers.push_back(backup);
    gp.Style.Colors[idx] = ImGui::ColorConvertU32ToFloat4(col);
}